

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::RandomOrderTexImageCubeCase::createTexture
          (RandomOrderTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  CubeFace CVar3;
  deUint32 format;
  deUint32 type;
  uint uVar4;
  deUint32 dVar5;
  CubeFace *pCVar6;
  uint uVar7;
  int width;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int ndx;
  long lVar12;
  float fVar13;
  deUint32 tex;
  int local_f4;
  vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> images;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_98;
  float local_68 [4];
  TextureLevel levelData;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  uVar9 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar9 = (this->super_TextureSpecCase).m_width;
    uVar4 = 0x20;
    uVar7 = 0x20;
    if (uVar9 != 0) {
      uVar7 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar9 = (this->super_TextureSpecCase).m_height;
    if (uVar9 != 0) {
      uVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    iVar11 = 0x1f - uVar4;
    if ((int)(0x1f - uVar4) < (int)(0x1f - uVar7)) {
      iVar11 = 0x1f - uVar7;
    }
    uVar9 = iVar11 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar5 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  vector(&images,(ulong)(uVar9 * 6),(allocator_type *)&local_98);
  if (uVar9 != 0) {
    pCVar6 = &(images.
               super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    uVar8 = 0;
    do {
      lVar10 = 0;
      do {
        pCVar6[lVar10 * 2 + -1] = (CubeFace)uVar8;
        pCVar6[lVar10 * 2] = (CubeFace)lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      uVar8 = uVar8 + 1;
      pCVar6 = pCVar6 + 0xc;
    } while (uVar8 != uVar9);
  }
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
            (&rnd,(__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
                   )images.
                    super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )images.
               super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  if (0 < (int)((ulong)((long)images.
                              super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)images.
                             super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar10 = 0;
    do {
      local_f4 = images.
                 super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar10].first;
      width = (this->super_TextureSpecCase).m_width >> ((byte)local_f4 & 0x1f);
      iVar11 = (this->super_TextureSpecCase).m_height >> ((byte)local_f4 & 0x1f);
      CVar3 = images.
              super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar10].second;
      local_98.super_ConstPixelBufferAccess.m_format.order = R;
      local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      if (width < 2) {
        width = 1;
      }
      gMax.m_data[0] = 1.0;
      gMax.m_data[1] = 1.0;
      gMax.m_data[2] = 1.0;
      gMax.m_data[3] = 1.0;
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar12 = 0;
      do {
        fVar1 = (float)local_98.super_ConstPixelBufferAccess.m_size.m_data[lVar12 + -2];
        fVar2 = gMax.m_data[lVar12];
        fVar13 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar12] = (fVar2 - fVar1) * fVar13 + fVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      local_98.super_ConstPixelBufferAccess.m_format.order = R;
      local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      local_68[0] = 1.0;
      local_68[1] = 1.0;
      local_68[2] = 1.0;
      local_68[3] = 1.0;
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar12 = 0;
      do {
        fVar1 = (float)local_98.super_ConstPixelBufferAccess.m_size.m_data[lVar12 + -2];
        fVar2 = local_68[lVar12];
        fVar13 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar12] = (fVar2 - fVar1) * fVar13 + fVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      tcu::TextureLevel::setSize(&levelData,width,iVar11,1);
      tcu::TextureLevel::getAccess(&local_98,&levelData);
      tcu::fillWithComponentGradients(&local_98,&gMin,&gMax);
      dVar5 = (&s_cubeMapFaces)[CVar3];
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_98,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (this_00,dVar5,local_f4,format,width,iVar11,0,format,type,
                 local_98.super_ConstPixelBufferAccess.m_data);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)images.
                                          super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)images.
                                         super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (images.
      super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(images.
                    super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)images.
                          super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)images.
                          super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Level-face pairs.
		vector<pair<int, tcu::CubeFace> >	images	(numLevels*6);

		for (int ndx = 0; ndx < numLevels; ndx++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				images[ndx*6 + face] = std::make_pair(ndx, (tcu::CubeFace)face);

		rnd.shuffle(images.begin(), images.end());

		for (int ndx = 0; ndx < (int)images.size(); ndx++)
		{
			int				levelNdx	= images[ndx].first;
			tcu::CubeFace	face		= images[ndx].second;
			int				levelW		= de::max(1, m_width >> levelNdx);
			int				levelH		= de::max(1, m_height >> levelNdx);
			Vec4			gMin		= randomVector<4>(rnd);
			Vec4			gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}